

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalGenerator::AddGlobalTarget_PackageSource
          (cmGlobalGenerator *this,
          vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
          *targets)

{
  cmMakefile *this_00;
  bool bVar1;
  int iVar2;
  reference ppcVar3;
  undefined4 extraout_var;
  char *pcVar4;
  string *__x;
  allocator local_159;
  undefined1 local_158 [8];
  string relConfigFile;
  undefined1 local_130 [8];
  string configFile;
  value_type local_108;
  undefined1 local_e8 [8];
  cmCustomCommandLine singleLine;
  undefined1 local_c0 [8];
  GlobalTargetInfo gti;
  char *packageSourceTargetName;
  cmMakefile *mf;
  vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
  *targets_local;
  cmGlobalGenerator *this_local;
  
  ppcVar3 = std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::operator[](&this->Makefiles,0)
  ;
  this_00 = *ppcVar3;
  iVar2 = (*this->_vptr_cmGlobalGenerator[0x1a])();
  gti._144_8_ = CONCAT44(extraout_var,iVar2);
  if (gti._144_8_ != 0) {
    GlobalTargetInfo::GlobalTargetInfo((GlobalTargetInfo *)local_c0);
    std::__cxx11::string::operator=((string *)local_c0,(char *)gti._144_8_);
    std::__cxx11::string::operator=
              ((string *)(gti.Name.field_2._M_local_buf + 8),
               "Run CPack packaging tool for source...");
    pcVar4 = cmMakefile::GetCurrentBinaryDirectory(this_00);
    std::__cxx11::string::operator=
              ((string *)
               &gti.Depends.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,pcVar4);
    gti.WorkingDir.field_2._M_local_buf[8] = '\x01';
    cmCustomCommandLine::cmCustomCommandLine((cmCustomCommandLine *)local_e8);
    __x = cmSystemTools::GetCPackCommand_abi_cxx11_();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_e8,__x);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_108,"--config",(allocator *)(configFile.field_2._M_local_buf + 0xf))
    ;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_e8,&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    std::allocator<char>::~allocator((allocator<char> *)(configFile.field_2._M_local_buf + 0xf));
    pcVar4 = cmMakefile::GetCurrentBinaryDirectory(this_00);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_130,pcVar4,(allocator *)(relConfigFile.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(relConfigFile.field_2._M_local_buf + 0xf));
    std::__cxx11::string::operator+=((string *)local_130,"/CPackSourceConfig.cmake");
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_158,"./CPackSourceConfig.cmake",&local_159);
    std::allocator<char>::~allocator((allocator<char> *)&local_159);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_e8,(value_type *)local_158);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    bVar1 = cmsys::SystemTools::FileExists(pcVar4);
    if (bVar1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_e8,(value_type *)local_130);
      std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
                ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)
                 ((long)&gti.Message.field_2 + 8),(value_type *)local_e8);
      std::
      vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
      ::push_back(targets,(value_type *)local_c0);
    }
    std::__cxx11::string::~string((string *)local_158);
    std::__cxx11::string::~string((string *)local_130);
    cmCustomCommandLine::~cmCustomCommandLine((cmCustomCommandLine *)local_e8);
    GlobalTargetInfo::~GlobalTargetInfo((GlobalTargetInfo *)local_c0);
  }
  return;
}

Assistant:

void cmGlobalGenerator::AddGlobalTarget_PackageSource(
  std::vector<GlobalTargetInfo>& targets)
{
  cmMakefile* mf = this->Makefiles[0];
  const char* packageSourceTargetName = this->GetPackageSourceTargetName();
  if (packageSourceTargetName) {
    GlobalTargetInfo gti;
    gti.Name = packageSourceTargetName;
    gti.Message = "Run CPack packaging tool for source...";
    gti.WorkingDir = mf->GetCurrentBinaryDirectory();
    gti.UsesTerminal = true;
    cmCustomCommandLine singleLine;
    singleLine.push_back(cmSystemTools::GetCPackCommand());
    singleLine.push_back("--config");
    std::string configFile = mf->GetCurrentBinaryDirectory();
    configFile += "/CPackSourceConfig.cmake";
    std::string relConfigFile = "./CPackSourceConfig.cmake";
    singleLine.push_back(relConfigFile);
    if (cmSystemTools::FileExists(configFile.c_str())) {
      singleLine.push_back(configFile);
      gti.CommandLines.push_back(singleLine);
      targets.push_back(gti);
    }
  }
}